

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O3

bool operator!=(QSupportedWritingSystems *lhs,QSupportedWritingSystems *rhs)

{
  ulong uVar1;
  
  if (lhs->d == rhs->d) {
    return false;
  }
  uVar1 = 0xffffffffffffffff;
  do {
    if ((lhs->d->list).d.ptr[uVar1 + 1] != (rhs->d->list).d.ptr[uVar1 + 1]) {
      return true;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x21);
  return uVar1 < 0x21;
}

Assistant:

bool operator!=(const QSupportedWritingSystems &lhs, const QSupportedWritingSystems &rhs)
{
    if (lhs.d == rhs.d)
        return false;

    Q_ASSERT(lhs.d->list.size() == rhs.d->list.size());
    Q_ASSERT(lhs.d->list.size() == QFontDatabase::WritingSystemsCount);
    for (int i = 0; i < QFontDatabase::WritingSystemsCount; ++i) {
        if (lhs.d->list.at(i) != rhs.d->list.at(i))
            return true;
    }

    return false;
}